

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O1

void __thiscall muduo::Thread::Thread(Thread *this,ThreadFunc *func,string *n)

{
  pointer pcVar1;
  undefined8 uVar2;
  
  this->started_ = false;
  this->joined_ = false;
  this->pthreadId_ = 0;
  this->tid_ = 0;
  *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
  (this->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func_)._M_invoker = func->_M_invoker;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->func_).super__Function_base._M_functor =
         *(undefined8 *)&(func->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = uVar2;
    (this->func_).super__Function_base._M_manager = (func->super__Function_base)._M_manager;
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
  }
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + n->_M_string_length);
  CountDownLatch::CountDownLatch(&this->latch_,1);
  setDefaultName(this);
  return;
}

Assistant:

Thread::Thread(ThreadFunc func, const string& n)
  : started_(false),
    joined_(false),
    pthreadId_(0),
    tid_(0),
    func_(std::move(func)),
    name_(n),
    latch_(1)
{
  setDefaultName();
}